

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_max_fd_shrink(void)

{
  fio_lock_i fVar1;
  fio_data_s *pfVar2;
  fio_data_s *pfVar3;
  uint uVar4;
  uint uVar5;
  fio_lock_i ret;
  timespec local_28;
  
  pfVar3 = fio_data;
  LOCK();
  fVar1 = fio_data->lock;
  fio_data->lock = '\x01';
  UNLOCK();
  pfVar2 = fio_data;
  while (fio_data = pfVar2, fVar1 != '\0') {
    local_28.tv_sec = 0;
    local_28.tv_nsec = 1;
    nanosleep(&local_28,(timespec *)0x0);
    LOCK();
    fVar1 = pfVar3->lock;
    pfVar3->lock = '\x01';
    UNLOCK();
    pfVar2 = fio_data;
  }
  uVar5 = pfVar2->max_protocol_fd;
  while ((uVar4 = 0, uVar5 != 0 &&
         (uVar4 = uVar5, *(long *)((long)pfVar2 + (ulong)uVar5 * 0xa8 + 0x58) == 0))) {
    uVar5 = uVar5 - 1;
  }
  pfVar2->max_protocol_fd = uVar4;
  LOCK();
  pfVar2->lock = '\0';
  UNLOCK();
  return;
}

Assistant:

static void fio_max_fd_shrink(void) {
  fio_lock(&fio_data->lock);
  uint32_t fd = fio_data->max_protocol_fd;
  while (fd && fd_data(fd).protocol == NULL)
    --fd;
  fio_data->max_protocol_fd = fd;
  fio_unlock(&fio_data->lock);
}